

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariableSpecification.cpp
# Opt level: O3

void __thiscall
DIS::StandardVariableSpecification::marshal
          (StandardVariableSpecification *this,DataStream *dataStream)

{
  undefined8 uVar1;
  pointer pSVar2;
  ulong uVar3;
  long lVar4;
  SimulationManagementPduHeader x;
  SimulationManagementPduHeader local_90;
  
  DataStream::operator<<
            (dataStream,
             (short)((uint)(*(int *)&(this->_standardVariables).
                                     super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_standardVariables).
                                    super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x5555);
  pSVar2 = (this->_standardVariables).
           super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_standardVariables).
      super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar2) {
    lVar4 = 0x58;
    uVar3 = 0;
    do {
      local_90._vptr_SimulationManagementPduHeader =
           (_func_int **)&PTR__SimulationManagementPduHeader_001b6098;
      local_90._pduHeader._vptr_PduHeader = (_func_int **)&PTR__PduHeader_001b57b0;
      uVar1 = *(undefined8 *)((long)pSVar2 + lVar4 + -0x48);
      local_90._pduHeader._16_5_ =
           SUB85((ulong)*(undefined8 *)((long)pSVar2 + lVar4 + -0x43) >> 0x18,0);
      local_90._pduHeader._8_5_ = SUB85(uVar1,0);
      local_90._pduHeader._timestamp._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
      local_90._originatingID._vptr_EntityID = (_func_int **)&PTR__EntityID_001b45b0;
      local_90._originatingID._simulationAddress._vptr_SimulationAddress =
           (_func_int **)&PTR__SimulationAddress_001b5fb8;
      local_90._originatingID._simulationAddress._8_4_ =
           *(undefined4 *)((long)pSVar2 + lVar4 + -0x28);
      local_90._originatingID._entityNumber = *(unsigned_short *)((long)pSVar2 + lVar4 + -0x20);
      local_90._recevingID._vptr_EntityID = (_func_int **)&PTR__EntityID_001b45b0;
      local_90._recevingID._simulationAddress._vptr_SimulationAddress =
           (_func_int **)&PTR__SimulationAddress_001b5fb8;
      local_90._recevingID._simulationAddress._8_4_ = *(undefined4 *)((long)pSVar2 + lVar4 + -8);
      local_90._recevingID._entityNumber =
           *(unsigned_short *)((long)&pSVar2->_vptr_SimulationManagementPduHeader + lVar4);
      SimulationManagementPduHeader::marshal(&local_90,dataStream);
      SimulationManagementPduHeader::~SimulationManagementPduHeader(&local_90);
      uVar3 = uVar3 + 1;
      pSVar2 = (this->_standardVariables).
               super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x60;
    } while (uVar3 < (ulong)(((long)(this->_standardVariables).
                                    super__Vector_base<DIS::SimulationManagementPduHeader,_std::allocator<DIS::SimulationManagementPduHeader>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void StandardVariableSpecification::marshal(DataStream& dataStream) const
{
    dataStream << ( unsigned short )_standardVariables.size();

     for(size_t idx = 0; idx < _standardVariables.size(); idx++)
     {
        SimulationManagementPduHeader x = _standardVariables[idx];
        x.marshal(dataStream);
     }

}